

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O0

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall
               (QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QNonContiguousByteDeviceThreadForwardImpl *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QNonContiguousByteDeviceThreadForwardImpl *_t;
  qint64 in_stack_ffffffffffffffb0;
  qint64 in_stack_ffffffffffffffb8;
  QByteArray *in_stack_ffffffffffffffc0;
  qint64 in_stack_ffffffffffffffc8;
  QNonContiguousByteDeviceThreadForwardImpl *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 0) {
    this = (QNonContiguousByteDeviceThreadForwardImpl *)(ulong)in_EDX;
    switch(this) {
    case (QNonContiguousByteDeviceThreadForwardImpl *)0x0:
      wantData((QNonContiguousByteDeviceThreadForwardImpl *)0x311fec,(qint64)this);
      break;
    case (QNonContiguousByteDeviceThreadForwardImpl *)0x1:
      processedData(this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      break;
    case (QNonContiguousByteDeviceThreadForwardImpl *)0x2:
      resetData((QNonContiguousByteDeviceThreadForwardImpl *)0x312028,(bool *)this);
      break;
    case (QNonContiguousByteDeviceThreadForwardImpl *)0x3:
      haveDataSlot(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0),in_stack_ffffffffffffffb0);
    }
  }
  if (((in_ESI == 5) &&
      (bVar1 = QtMocHelpers::
               indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(long_long)>
                         (in_RCX,(void **)wantData,0,0), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(long_long,long_long)>
                        (in_RCX,(void **)processedData,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(bool*)>
              (in_RCX,(void **)resetData,0,2);
  }
  return;
}

Assistant:

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNonContiguousByteDeviceThreadForwardImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->wantData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 1: _t->processedData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 2: _t->resetData((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 3: _t->haveDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::wantData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 , qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::processedData, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(bool * )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::resetData, 2))
            return;
    }
}